

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::DatabaseInterface::load_blacklist_database(DatabaseInterface *this,char *path)

{
  Impl *pIVar1;
  DatabaseInterface *pDVar2;
  bool bVar3;
  LogLevel LVar4;
  int iVar5;
  DatabaseInterface *pDVar6;
  
  pIVar1 = this->impl;
  if (pIVar1->mode == ReadOnly) {
    if ((pIVar1->imported_metadata).
        super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pIVar1->imported_metadata).
        super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pDVar6 = create_stream_archive_database(path,ReadOnly);
      pDVar2 = (pIVar1->blacklist)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (pIVar1->blacklist)._M_t.
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar6;
      if (pDVar2 != (DatabaseInterface *)0x0) {
        (*pDVar2->_vptr_DatabaseInterface[1])();
      }
      pDVar2 = (this->impl->blacklist)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (pDVar2 != (DatabaseInterface *)0x0) {
        iVar5 = (*pDVar2->_vptr_DatabaseInterface[2])();
        if ((char)iVar5 != '\0') {
          return true;
        }
        pDVar2 = (this->impl->blacklist)._M_t.
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        (this->impl->blacklist)._M_t.
        super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
        .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
             (DatabaseInterface *)0x0;
        if (pDVar2 != (DatabaseInterface *)0x0) {
          (*pDVar2->_vptr_DatabaseInterface[1])();
        }
      }
    }
    else {
      LVar4 = get_thread_log_level();
      if ((int)LVar4 < 3) {
        bVar3 = Internal::log_thread_callback
                          (LOG_ERROR,"Cannot use imported metadata together with blacklists.\n");
        if (bVar3) {
          return false;
        }
        load_blacklist_database();
      }
    }
  }
  return false;
}

Assistant:

bool DatabaseInterface::load_blacklist_database(const char *path)
{
	if (impl->mode != DatabaseMode::ReadOnly)
		return false;

	if (!impl->imported_metadata.empty())
	{
		LOGE_LEVEL("Cannot use imported metadata together with blacklists.\n");
		return false;
	}

	impl->blacklist.reset(create_stream_archive_database(path, DatabaseMode::ReadOnly));

	if (!impl->blacklist)
		return false;

	if (!impl->blacklist->prepare())
	{
		impl->blacklist.reset();
		return false;
	}

	return true;
}